

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_smax_i64_mips64el(TCGContext_conflict6 *tcg_ctx,TCGv_i64 ret,TCGv_i64 a,TCGv_i64 b)

{
  TCGv_i64 b_local;
  TCGv_i64 a_local;
  TCGv_i64 ret_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_LT,ret,a,b,b,a);
  return;
}

Assistant:

void tcg_gen_smax_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 a, TCGv_i64 b)
{
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, ret, a, b, b, a);
}